

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  Program p;
  ExecutionEngine local_41;
  undefined1 auStack_40 [7];
  ExecutionEngine e;
  int *local_38;
  Value *local_30;
  Compiler local_21;
  undefined1 auStack_20 [7];
  Compiler c;
  Program pt;
  
  Compiler::Compiler(&local_21,"../Test.gs");
  Compiler::build(&local_21);
  Compiler::dump((Program *)auStack_40,&local_21);
  auStack_20._0_4_ = auStack_40._0_4_;
  stack0xffffffffffffffe4 = stack0xffffffffffffffc4;
  p.instr = local_38;
  p.conSize = auStack_40._0_4_;
  p.inSize = stack0xffffffffffffffc4;
  p.Consts = local_30;
  ExecutionEngine::ExecutionEngine(&local_41,p);
  ExecutionEngine::run(&local_41);
  return 0;
}

Assistant:

int main() {
  Program pt; 
  Compiler c("../Test.gs");
  c.build();
  pt = c.dump();

  ExecutionEngine e(pt);
  e.run();
}